

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O2

void get_num_nodes<long>(ExtIsoForest *model_outputs,long *n_nodes,long *n_terminal,int nthreads)

{
  pointer pvVar1;
  pointer pIVar2;
  long lVar3;
  long lVar4;
  const_iterator __end2;
  size_t hplane;
  const_iterator __begin2;
  pointer pIVar5;
  
  pvVar1 = (model_outputs->hplanes).
           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = ((long)(model_outputs->hplanes).
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
  for (lVar4 = 0; lVar3 * 8 - lVar4 != 0; lVar4 = lVar4 + 8) {
    *(undefined8 *)((long)n_terminal + lVar4) = 0;
  }
  for (lVar4 = 0; lVar4 != lVar3; lVar4 = lVar4 + 1) {
    pIVar5 = *(pointer *)
              &pvVar1[lVar4].super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>._M_impl;
    pIVar2 = *(pointer *)
              ((long)&pvVar1[lVar4].super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>.
                      _M_impl + 8);
    n_nodes[lVar4] = ((long)pIVar2 - (long)pIVar5) / 0xf8;
    for (; pIVar5 != pIVar2; pIVar5 = pIVar5 + 1) {
      n_terminal[lVar4] = n_terminal[lVar4] + (ulong)(pIVar5->hplane_left == 0);
    }
  }
  return;
}

Assistant:

void get_num_nodes(const ExtIsoForest &model_outputs, sparse_ix *restrict n_nodes, sparse_ix *restrict n_terminal, int nthreads) noexcept
{
    std::fill(n_terminal, n_terminal + model_outputs.hplanes.size(), 0);
    #pragma omp parallel for schedule(static) num_threads(nthreads) shared(model_outputs, n_nodes, n_terminal)
    for (size_t_for hplane = 0; hplane <(decltype(hplane)) model_outputs.hplanes.size(); hplane++)
    {
        n_nodes[hplane] = model_outputs.hplanes[hplane].size();
        for (const IsoHPlane &node : model_outputs.hplanes[hplane])
        {
            n_terminal[hplane] += (node.hplane_left == 0);
        }
    }
}